

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

bool __thiscall cfd::core::ByteData160::IsEmpty(ByteData160 *this)

{
  bool bVar1;
  allocator_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,0x14,&local_29);
  memset(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,0,
         (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  bVar1 = ::std::operator==(&this->data_,&data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool ByteData160::IsEmpty() const {
  std::vector<uint8_t> data(kByteData160Length);
  memset(data.data(), 0, data.size());
  return data_ == data;
}